

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void * ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,void *ptr,ZSTD_compressionParameters *cParams,
                 ZSTD_compResetPolicy_e crp,U32 forCCtx)

{
  U32 *pUVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint local_60;
  uint local_5c;
  long local_58;
  size_t tableSpace;
  size_t h3Size;
  U32 hashLog3;
  size_t hSize;
  size_t chainSize;
  U32 forCCtx_local;
  ZSTD_compResetPolicy_e crp_local;
  ZSTD_compressionParameters *cParams_local;
  void *ptr_local;
  ZSTD_matchState_t *ms_local;
  
  if (cParams->strategy == ZSTD_fast) {
    local_58 = 0;
  }
  else {
    local_58 = 1L << ((byte)cParams->chainLog & 0x3f);
  }
  lVar3 = 1L << ((byte)cParams->hashLog & 0x3f);
  if ((forCCtx == 0) || (cParams->minMatch != 3)) {
    local_60 = 0;
  }
  else {
    if (cParams->windowLog < 0x12) {
      local_5c = cParams->windowLog;
    }
    else {
      local_5c = 0x11;
    }
    local_60 = local_5c;
  }
  lVar4 = 1L << ((byte)local_60 & 0x3f);
  ms->hashLog3 = local_60;
  memset(ms,0,0x20);
  (ms->window).dictLimit = 1;
  (ms->window).lowLimit = 1;
  (ms->window).nextSrc = (ms->window).base + 1;
  ZSTD_invalidateMatchState(ms);
  cParams_local = (ZSTD_compressionParameters *)ptr;
  if ((forCCtx != 0) && (ZSTD_btlazy2 < cParams->strategy)) {
    (ms->opt).litFreq = (uint *)ptr;
    (ms->opt).litLengthFreq = (ms->opt).litFreq + 0x100;
    (ms->opt).matchLengthFreq = (ms->opt).litLengthFreq + 0x24;
    (ms->opt).offCodeFreq = (ms->opt).matchLengthFreq + 0x35;
    (ms->opt).matchTable = (ZSTD_match_t *)((ms->opt).offCodeFreq + 0x20);
    (ms->opt).priceTable = (ZSTD_optimal_t *)((ms->opt).matchTable + 0x1001);
    cParams_local = (ZSTD_compressionParameters *)((ms->opt).priceTable + 0x1001);
  }
  if (crp != ZSTDcrp_noMemset) {
    memset(cParams_local,0,(local_58 + lVar3 + lVar4) * 4);
  }
  ms->hashTable = &cParams_local->windowLog;
  ms->chainTable = ms->hashTable + lVar3;
  ms->hashTable3 = ms->chainTable + local_58;
  pUVar1 = ms->hashTable3;
  uVar2 = cParams->chainLog;
  (ms->cParams).windowLog = cParams->windowLog;
  (ms->cParams).chainLog = uVar2;
  uVar2 = cParams->searchLog;
  (ms->cParams).hashLog = cParams->hashLog;
  (ms->cParams).searchLog = uVar2;
  uVar2 = cParams->targetLength;
  (ms->cParams).minMatch = cParams->minMatch;
  (ms->cParams).targetLength = uVar2;
  (ms->cParams).strategy = cParams->strategy;
  return pUVar1 + lVar4;
}

Assistant:

static void*
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      void* ptr,
                const ZSTD_compressionParameters* cParams,
                      ZSTD_compResetPolicy_e const crp, U32 const forCCtx)
{
    size_t const chainSize = (cParams->strategy == ZSTD_fast) ? 0 : ((size_t)1 << cParams->chainLog);
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = (forCCtx && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = ((size_t)1) << hashLog3;
    size_t const tableSpace = (chainSize + hSize + h3Size) * sizeof(U32);

    assert(((size_t)ptr & 3) == 0);

    ms->hashLog3 = hashLog3;
    memset(&ms->window, 0, sizeof(ms->window));
    ms->window.dictLimit = 1;    /* start from 1, so that 1st position is valid */
    ms->window.lowLimit = 1;     /* it ensures first and later CCtx usages compress the same */
    ms->window.nextSrc = ms->window.base + 1;   /* see issue #1241 */
    ZSTD_invalidateMatchState(ms);

    /* opt parser space */
    if (forCCtx && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ptr;
        ms->opt.litLengthFreq = ms->opt.litFreq + (1<<Litbits);
        ms->opt.matchLengthFreq = ms->opt.litLengthFreq + (MaxLL+1);
        ms->opt.offCodeFreq = ms->opt.matchLengthFreq + (MaxML+1);
        ptr = ms->opt.offCodeFreq + (MaxOff+1);
        ms->opt.matchTable = (ZSTD_match_t*)ptr;
        ptr = ms->opt.matchTable + ZSTD_OPT_NUM+1;
        ms->opt.priceTable = (ZSTD_optimal_t*)ptr;
        ptr = ms->opt.priceTable + ZSTD_OPT_NUM+1;
    }

    /* table Space */
    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_noMemset);
    assert(((size_t)ptr & 3) == 0);  /* ensure ptr is properly aligned */
    if (crp!=ZSTDcrp_noMemset) memset(ptr, 0, tableSpace);   /* reset tables only */
    ms->hashTable = (U32*)(ptr);
    ms->chainTable = ms->hashTable + hSize;
    ms->hashTable3 = ms->chainTable + chainSize;
    ptr = ms->hashTable3 + h3Size;

    ms->cParams = *cParams;

    assert(((size_t)ptr & 3) == 0);
    return ptr;
}